

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_mem.h
# Opt level: O0

void __thiscall phyr::MemoryPool::reset(MemoryPool *this)

{
  list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  *plVar1;
  int in_ECX;
  list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  *in_RDI;
  __off64_t *in_R8;
  size_t in_R9;
  iterator local_18;
  _List_const_iterator<std::pair<unsigned_char_*,_unsigned_long>_> local_10 [2];
  
  (in_RDI->
  super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  )._M_impl._M_node._M_size = 0;
  plVar1 = in_RDI + 1;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
       ::begin(in_RDI);
  std::_List_const_iterator<std::pair<unsigned_char_*,_unsigned_long>_>::_List_const_iterator
            (local_10,&local_18);
  std::__cxx11::
  list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  ::splice((list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
            *)&(plVar1->
               super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
               )._M_impl._M_node._M_size,(int)local_10[0]._M_node,
           (__off64_t *)
           &in_RDI[2].
            super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
            ._M_impl._M_node._M_size,in_ECX,in_R8,in_R9,(uint)in_RDI);
  return;
}

Assistant:

void reset() {
        // Don't stash, current block can be reused
        curBlockOffset = 0;
        // Move all used block data to free blocks set
        freeBlocks.splice(freeBlocks.begin(), usedBlocks);
    }